

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIStaticText::breakText(CGUIStaticText *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  u32 begin;
  long *plVar5;
  IGUIFont *pIVar6;
  undefined4 extraout_var;
  int iVar7;
  uint uVar8;
  size_type __pos;
  ulong uVar9;
  ulong uVar10;
  size_type __pos_1;
  wchar_t wVar11;
  bool bVar12;
  stringw first;
  stringw word;
  stringw second;
  stringw line;
  stringw whitespace;
  string<wchar_t> local_140;
  vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>> *local_120;
  int local_114;
  string<wchar_t> local_110;
  ulong local_f0;
  string<wchar_t> local_e8;
  undefined1 local_c8 [32];
  long *local_a8;
  string<wchar_t> local_a0;
  IGUIFont *local_80;
  undefined8 local_78;
  string<wchar_t> local_70;
  string<wchar_t> local_50;
  
  if (this->WordWrap == true) {
    local_c8._0_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c8._8_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8._16_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::~vector
              ((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_> *)
               local_c8);
    (this->BrokenText).is_sorted = true;
    plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    pIVar6 = (IGUIFont *)(**(code **)(*(long *)this + 0x130))(this);
    if (pIVar6 != (IGUIFont *)0x0) {
      this->LastBreakFont = pIVar6;
      local_c8._0_8_ = local_c8 + 0x10;
      local_c8._8_8_ = (pointer)0x0;
      local_c8._16_8_ = local_c8._16_8_ & 0xffffffff00000000;
      local_110.str._M_dataplus._M_p = (pointer)&local_110.str.field_2;
      local_110.str._M_string_length = 0;
      local_110.str.field_2._M_local_buf[0] = L'\0';
      local_a0.str._M_dataplus._M_p = (pointer)&local_a0.str.field_2;
      local_a0.str._M_string_length = 0;
      local_a0.str.field_2._M_local_buf[0] = L'\0';
      uVar10 = *(ulong *)&this->field_0xb0;
      iVar7 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      if (this->Border == true) {
        iVar3 = (**(code **)(*plVar5 + 0x10))(plVar5,8);
        iVar7 = iVar7 + iVar3 * -2;
      }
      local_120 = (vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>> *)
                  &this->BrokenText;
      local_a8 = (long *)&this->field_0xa8;
      uVar8 = (uint)uVar10;
      local_114 = iVar7;
      local_80 = pIVar6;
      if (this->RightToLeft == false) {
        if (0 < (int)uVar8) {
          iVar7 = 0;
          uVar9 = 1;
          do {
            uVar8 = *(uint *)(*local_a8 + -4 + uVar9 * 4);
            bVar2 = false;
            if (uVar8 == 10) {
              bVar2 = true;
              uVar8 = 0;
            }
            else if (uVar8 == 0xd) {
              bVar2 = true;
              uVar8 = 0;
              if (*(int *)(*local_a8 + uVar9 * 4) == 10) {
                ::std::__cxx11::wstring::_M_erase((ulong)local_a8,uVar9);
                uVar10 = (ulong)((int)uVar10 - 1);
              }
            }
            if (((uVar8 & 0xffffffdf) == 0) ||
               (::std::__cxx11::wstring::_M_replace_aux
                          ((ulong)&local_110,local_110.str._M_string_length,0,L'\x01'),
               uVar9 - 1 == (ulong)((int)uVar10 - 1))) {
              pIVar6 = local_80;
              if ((int)local_110.str._M_string_length != 0) {
                local_f0 = uVar10;
                iVar3 = (*local_80->_vptr_IGUIFont[1])(local_80,local_a0.str._M_dataplus._M_p);
                iVar4 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,local_110.str._M_dataplus._M_p);
                if (local_114 < iVar4) {
                  begin = ::std::__cxx11::wstring::find((wchar_t)&local_110,0xad);
                  if (begin == 0xffffffff) {
                    if (iVar7 != 0) {
                      std::
                      vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                      ::push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                   *)local_120,(value_type *)local_c8);
                      (this->BrokenText).is_sorted = false;
                    }
LAB_00227624:
                    ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                    uVar10 = local_f0;
                    iVar7 = iVar4;
                  }
                  else {
                    core::string<wchar_t>::subString(&local_140,&local_110,0,begin,false);
                    core::string<wchar_t>::subString
                              (&local_e8,&local_110,begin,
                               (int)local_110.str._M_string_length - begin,false);
                    core::string<wchar_t>::operator+
                              (&local_70,(string<wchar_t> *)local_c8,&local_140);
                    core::string<wchar_t>::operator+(&local_50,&local_70,L"-");
                    ::std::
                    vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>>::
                    emplace_back<irr::core::string<wchar_t>>(local_120,&local_50);
                    (this->BrokenText).is_sorted = false;
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
                      operator_delete(local_50.str._M_dataplus._M_p,
                                      local_50.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_70.str._M_dataplus._M_p != &local_70.str.field_2) {
                      operator_delete(local_70.str._M_dataplus._M_p,
                                      local_70.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                    iVar7 = (*local_80->_vptr_IGUIFont[1])(local_80,local_e8.str._M_dataplus._M_p);
                    ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                    uVar10 = local_f0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                      operator_delete(local_e8.str._M_dataplus._M_p,
                                      CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                               local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                      operator_delete(local_140.str._M_dataplus._M_p,
                                      local_140.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                  }
                }
                else {
                  if ((iVar7 != 0) && (local_114 < iVar7 + iVar3 + iVar4)) {
                    std::
                    vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                    ::push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                 *)local_120,(value_type *)local_c8);
                    (this->BrokenText).is_sorted = false;
                    goto LAB_00227624;
                  }
                  ::std::__cxx11::wstring::_M_append
                            ((wchar_t *)local_c8,(ulong)local_a0.str._M_dataplus._M_p);
                  ::std::__cxx11::wstring::_M_append
                            ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
                  iVar7 = iVar7 + iVar3 + iVar4;
                  uVar10 = local_f0;
                }
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=(&local_a0,L"");
              }
              if ((uVar8 & 0xffffffdf) == 0) {
                ::std::__cxx11::wstring::_M_replace_aux
                          ((ulong)&local_a0,local_a0.str._M_string_length,0,L'\x01');
              }
              if (bVar2) {
                ::std::__cxx11::wstring::_M_append
                          ((wchar_t *)local_c8,(ulong)local_a0.str._M_dataplus._M_p);
                ::std::__cxx11::wstring::_M_append
                          ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
                std::
                vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                           *)local_120,(string<wchar_t> *)local_c8);
                (this->BrokenText).is_sorted = false;
                core::string<wchar_t>::operator=((string<wchar_t> *)local_c8,L"");
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=(&local_a0,L"");
                iVar7 = 0;
              }
            }
            bVar2 = (long)uVar9 < (long)(int)uVar10;
            uVar9 = uVar9 + 1;
          } while (bVar2);
        }
        ::std::__cxx11::wstring::_M_append((wchar_t *)local_c8,(ulong)local_a0.str._M_dataplus._M_p)
        ;
        ::std::__cxx11::wstring::_M_append
                  ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
      }
      else {
        if (-1 < (int)uVar8) {
          uVar10 = (ulong)(uVar8 & 0x7fffffff);
          iVar7 = 0;
          do {
            wVar11 = *(wchar_t *)(*local_a8 + uVar10 * 4);
            bVar2 = false;
            if (wVar11 == L'\n') {
              bVar2 = true;
              wVar11 = L'\0';
            }
            else if (wVar11 == L'\r') {
              bVar2 = true;
              wVar11 = L'\0';
              if ((uVar10 != 0) &&
                 (uVar9 = (ulong)((int)uVar10 - 1), *(int *)(*local_a8 + uVar9 * 4) == 10)) {
                ::std::__cxx11::wstring::_M_erase((ulong)local_a8,uVar9);
                wVar11 = L'\0';
              }
            }
            bVar12 = uVar10 == 0;
            uVar10 = uVar10 - 1;
            if ((bVar12) || ((wVar11 & 0xffffffdfU) == 0)) {
              if ((int)local_110.str._M_string_length != 0) {
                local_f0 = uVar10;
                iVar3 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,local_a0.str._M_dataplus._M_p);
                iVar4 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,local_110.str._M_dataplus._M_p);
                if ((iVar7 == 0) || (iVar7 + iVar3 + iVar4 <= local_114)) {
                  local_78 = CONCAT44(extraout_var,iVar3);
                  core::string<wchar_t>::operator+(&local_140,&local_a0,(string<wchar_t> *)local_c8)
                  ;
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                    operator_delete(local_140.str._M_dataplus._M_p,
                                    local_140.str.field_2._M_allocated_capacity * 4 + 4);
                  }
                  core::string<wchar_t>::operator+
                            (&local_140,&local_110,(string<wchar_t> *)local_c8);
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                    operator_delete(local_140.str._M_dataplus._M_p,
                                    local_140.str.field_2._M_allocated_capacity * 4 + 4);
                  }
                  iVar7 = iVar7 + (int)local_78 + iVar4;
                }
                else {
                  std::
                  vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                  push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                             *)local_120,(value_type *)local_c8);
                  (this->BrokenText).is_sorted = false;
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  iVar7 = iVar4;
                }
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=(&local_a0,L"");
                uVar10 = local_f0;
                pIVar6 = local_80;
              }
              if (wVar11 != L'\0') {
                local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
                local_e8.str._M_string_length = 0;
                local_e8.str.field_2._M_local_buf[0] = L'\0';
                ::std::__cxx11::wstring::resize((ulong)&local_e8,L'\x01');
                *local_e8.str._M_dataplus._M_p = wVar11;
                core::string<wchar_t>::operator+(&local_140,&local_e8,&local_a0);
                ::std::__cxx11::wstring::_M_assign((wstring *)&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                  operator_delete(local_e8.str._M_dataplus._M_p,
                                  CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                           local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
                }
              }
              if (bVar2) {
                core::string<wchar_t>::operator+(&local_140,&local_a0,(string<wchar_t> *)local_c8);
                ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                core::string<wchar_t>::operator+(&local_140,&local_110,(string<wchar_t> *)local_c8);
                ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                std::
                vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                           *)local_120,(string<wchar_t> *)local_c8);
                (this->BrokenText).is_sorted = false;
                core::string<wchar_t>::operator=((string<wchar_t> *)local_c8,L"");
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=(&local_a0,L"");
                iVar7 = 0;
              }
            }
            else {
              local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
              local_e8.str._M_string_length = 0;
              local_e8.str.field_2._M_local_buf[0] = L'\0';
              ::std::__cxx11::wstring::resize((ulong)&local_e8,L'\x01');
              *local_e8.str._M_dataplus._M_p = wVar11;
              core::string<wchar_t>::operator+(&local_140,&local_e8,&local_110);
              ::std::__cxx11::wstring::_M_assign((wstring *)&local_110);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                operator_delete(local_140.str._M_dataplus._M_p,
                                local_140.str.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                operator_delete(local_e8.str._M_dataplus._M_p,
                                CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                         local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
              }
            }
          } while (uVar10 != 0xffffffffffffffff && -1 < (long)(uVar10 + 1));
        }
        core::string<wchar_t>::operator+(&local_140,&local_a0,(string<wchar_t> *)local_c8);
        ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
        paVar1 = &local_140.str.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_140.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_140.str._M_dataplus._M_p,
                          local_140.str.field_2._M_allocated_capacity * 4 + 4);
        }
        core::string<wchar_t>::operator+(&local_140,&local_110,(string<wchar_t> *)local_c8);
        ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_140.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_140.str._M_dataplus._M_p,
                          local_140.str.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
      push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_> *)
                local_120,(value_type *)local_c8);
      (this->BrokenText).is_sorted = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_a0.str._M_dataplus._M_p != &local_a0.str.field_2) {
        operator_delete(local_a0.str._M_dataplus._M_p,
                        CONCAT44(local_a0.str.field_2._M_local_buf[1],
                                 local_a0.str.field_2._M_local_buf[0]) * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_110.str._M_dataplus._M_p != &local_110.str.field_2) {
        operator_delete(local_110.str._M_dataplus._M_p,
                        CONCAT44(local_110.str.field_2._M_local_buf[1],
                                 local_110.str.field_2._M_local_buf[0]) * 4 + 4);
      }
      if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ * 4 + 4);
      }
    }
  }
  return;
}

Assistant:

void CGUIStaticText::breakText()
{
	if (!WordWrap)
		return;

	BrokenText.clear();

	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = getActiveFont();
	if (!font)
		return;

	LastBreakFont = font;

	core::stringw line;
	core::stringw word;
	core::stringw whitespace;
	s32 size = Text.size();
	s32 length = 0;
	s32 elWidth = RelativeRect.getWidth();
	if (Border)
		elWidth -= 2 * skin->getSize(EGDS_TEXT_DISTANCE_X);
	wchar_t c;

	// We have to deal with right-to-left and left-to-right differently
	// However, most parts of the following code is the same, it's just
	// some order and boundaries which change.
	if (!RightToLeft) {
		// regular (left-to-right)
		for (s32 i = 0; i < size; ++i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if (Text[i + 1] == L'\n') { // Windows breaks
					Text.erase(i + 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			bool isWhitespace = (c == L' ' || c == 0);
			if (!isWhitespace) {
				// part of a word
				word += c;
			}

			if (isWhitespace || i == (size - 1)) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (wordlgth > elWidth) {
						// This word is too long to fit in the available space, look for
						// the Unicode Soft HYphen (SHY / 00AD) character for a place to
						// break the word at
						int where = word.findFirst(wchar_t(0x00AD));
						if (where != -1) {
							core::stringw first = word.subString(0, where);
							core::stringw second = word.subString(where, word.size() - where);
							BrokenText.push_back(line + first + L"-");
							const s32 secondLength = font->getDimension(second.c_str()).Width;

							length = secondLength;
							line = second;
						} else {
							// No soft hyphen found, so there's nothing more we can do
							// break to next line
							if (length)
								BrokenText.push_back(line);
							length = wordlgth;
							line = word;
						}
					} else if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line += whitespace;
						line += word;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (isWhitespace) {
					whitespace += c;
				}

				// compute line break
				if (lineBreak) {
					line += whitespace;
					line += word;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			}
		}

		line += whitespace;
		line += word;
		BrokenText.push_back(line);
	} else {
		// right-to-left
		for (s32 i = size; i >= 0; --i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if ((i > 0) && Text[i - 1] == L'\n') { // Windows breaks
					Text.erase(i - 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			if (c == L' ' || c == 0 || i == 0) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line = whitespace + line;
						line = word + line;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (c != 0)
					whitespace = core::stringw(&c, 1) + whitespace;

				// compute line break
				if (lineBreak) {
					line = whitespace + line;
					line = word + line;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			} else {
				// yippee this is a word..
				word = core::stringw(&c, 1) + word;
			}
		}

		line = whitespace + line;
		line = word + line;
		BrokenText.push_back(line);
	}
}